

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClassPropertyDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassPropertyDeclarationSyntax,slang::syntax::ClassPropertyDeclarationSyntax_const&>
          (BumpAllocator *this,ClassPropertyDeclarationSyntax *args)

{
  ClassPropertyDeclarationSyntax *this_00;
  
  this_00 = (ClassPropertyDeclarationSyntax *)allocate(this,0x90,8);
  slang::syntax::ClassPropertyDeclarationSyntax::ClassPropertyDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }